

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

uchar * stbtt_GetGlyphSDF(stbtt_fontinfo *info,float scale,int glyph,int padding,uchar onedge_value,
                         float pixel_dist_scale,int *width,int *height,int *xoff,int *yoff)

{
  short sVar1;
  short sVar2;
  ushort uVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  undefined8 *puVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  stbtt_fontinfo *psVar13;
  uint uVar14;
  int iVar15;
  nk_allocator *alloc;
  uchar *puVar16;
  stbtt_vertex *psVar17;
  int iVar18;
  uint uVar19;
  undefined7 in_register_00000009;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  uint uVar25;
  int iVar24;
  short sVar26;
  ushort uVar27;
  ushort uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  uint in_XMM0_Db;
  double dVar33;
  float extraout_XMM0_Db;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  undefined1 auVar34 [16];
  undefined8 extraout_XMM0_Qb;
  float extraout_XMM0_Dd;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  int iy1;
  int ix0;
  int ix1;
  stbtt_vertex *verts;
  int local_1b8;
  float local_1b4;
  int local_1b0;
  int local_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  long local_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  stbtt_fontinfo *local_a8;
  uchar *local_a0;
  float local_98;
  uint uStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  uint uStack_84;
  float fStack_80;
  float fStack_7c;
  stbtt_vertex *local_78;
  double local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  stbtt_vertex *local_38;
  
  fVar42 = 0.0;
  fVar43 = 0.0;
  fVar44 = 0.0;
  if ((scale != 0.0) || (NAN(scale))) {
    local_198 = CONCAT44(local_198._4_4_,(int)CONCAT71(in_register_00000009,onedge_value));
    local_120 = pixel_dist_scale;
    local_a8 = info;
    local_88 = scale;
    uStack_84 = in_XMM0_Db;
    fStack_80 = in_XMM0_Dc;
    fStack_7c = in_XMM0_Dd;
    stbtt_GetGlyphBitmapBoxSubpixel
              (info,glyph,scale,scale,0.0,0.0,&local_1ac,&local_1b8,&local_17c,&local_1b0);
    psVar13 = local_a8;
    if ((local_1ac != local_17c) && (local_1b8 != local_1b0)) {
      local_1ac = local_1ac - padding;
      local_1b8 = local_1b8 - padding;
      local_17c = local_17c + padding;
      local_1b0 = local_1b0 + padding;
      local_188 = local_17c - local_1ac;
      if (width != (int *)0x0) {
        *width = local_188;
      }
      iVar23 = local_1b0 - local_1b8;
      if (height != (int *)0x0) {
        *height = iVar23;
      }
      if (xoff != (int *)0x0) {
        *xoff = local_1ac;
      }
      if (yoff != (int *)0x0) {
        *yoff = local_1b8;
      }
      local_98 = -local_88;
      uStack_94 = uStack_84 ^ 0x80000000;
      fStack_90 = -fStack_80;
      fStack_8c = -fStack_7c;
      uVar14 = stbtt_GetGlyphShape(local_a8,glyph,&local_38);
      puVar7 = (undefined8 *)psVar13->userdata;
      uVar31 = 0;
      puVar16 = (uchar *)(*(code *)puVar7[1])(*puVar7,0,(long)(iVar23 * local_188));
      puVar7 = (undefined8 *)psVar13->userdata;
      local_160 = (*(code *)puVar7[1])(*puVar7,0,(long)(int)uVar14 * 4);
      uVar30 = (ulong)(uVar14 - 1);
      uVar22 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar22 = uVar31;
      }
      fVar52 = 0.0;
      fVar53 = 0.0;
      fVar54 = 0.0;
      psVar17 = local_38;
      for (; uVar22 != uVar31; uVar31 = uVar31 + 1) {
        iVar23 = (int)uVar30;
        if (psVar17->type == '\x03') {
          fVar46 = (float)(int)psVar17->cx * local_88;
          fVar45 = (float)(int)psVar17->cy * local_98;
          fVar46 = ((float)(int)psVar17->x * local_88 - (fVar46 + fVar46)) +
                   (float)(int)local_38[iVar23].x * local_88;
          fVar45 = ((float)(int)psVar17->y * local_98 - (fVar45 + fVar45)) -
                   (float)(int)local_38[iVar23].y * local_88;
          fVar46 = fVar46 * fVar46 + fVar45 * fVar45;
          fVar45 = 0.0;
          if ((fVar46 != 0.0) || (NAN(fVar46))) {
            fVar45 = 1.0 / fVar46;
          }
        }
        else {
          fVar45 = 0.0;
          if (psVar17->type == '\x02') {
            fVar42 = (float)(int)local_38[iVar23].x * local_88 -
                     (float)(int)((long)((ulong)(ushort)psVar17->x << 0x30) >> 0x30) * local_88;
            fVar43 = (float)(int)psVar17->y * local_88 -
                     (float)(int)((long)((ulong)(ushort)local_38[iVar23].y << 0x30) >> 0x30) *
                     local_88;
            fVar46 = SQRT(fVar42 * fVar42 + fVar43 * fVar43);
            fVar42 = 0.0;
            fVar43 = 0.0;
            fVar44 = 0.0;
            fVar45 = (float)(~-(uint)(fVar46 == 0.0) & (uint)(1.0 / fVar46));
          }
        }
        *(float *)(local_160 + uVar31 * 4) = fVar45;
        uVar30 = uVar31 & 0xffffffff;
        psVar17 = psVar17 + 1;
      }
      local_124 = (float)(byte)local_198;
      local_78 = local_38 + -1;
      local_d8 = local_88;
      fStack_d4 = local_98;
      fStack_d0 = fStack_80;
      fStack_cc = fStack_7c;
      iVar23 = local_1b8;
      local_a0 = puVar16;
      do {
        psVar13 = local_a8;
        if (local_1b0 <= iVar23) {
          (**(code **)((long)local_a8->userdata + 0x10))(*local_a8->userdata,local_160);
          (**(code **)((long)psVar13->userdata + 0x10))(*psVar13->userdata,local_38);
          return puVar16;
        }
        fVar46 = (float)iVar23 + 0.5;
        local_128 = fVar46 / local_98;
        local_70 = (double)local_128;
        local_130 = local_128 + -0.01;
        local_11c = local_128 + 0.01;
        iVar21 = local_1ac;
        local_184 = iVar23;
        while (iVar21 < local_17c) {
          fVar32 = (float)iVar21 + 0.5;
          local_180 = iVar21;
          dVar33 = fmod(local_70,1.0);
          fVar45 = local_11c;
          if ((0.01 <= (float)dVar33) && (fVar45 = local_128, 0.99 < (float)dVar33)) {
            fVar45 = local_130;
          }
          fVar50 = fVar32 / local_88;
          local_1b4 = fVar45 * 0.0 + fVar50;
          fVar49 = fVar50 * 0.0 - fVar45;
          lVar29 = 0;
          iVar23 = 0;
          fVar55 = local_d8;
          fVar56 = fStack_d4;
          fVar57 = fStack_d0;
          fVar58 = fStack_cc;
          local_158 = fVar49;
          while( true ) {
            fVar59 = 0.0;
            fVar60 = 0.0;
            fVar61 = 0.0;
            if (uVar22 * 0xe - lVar29 == 0) break;
            fVar59 = fVar42;
            fVar60 = fVar43;
            fVar61 = fVar44;
            if ((&local_38->type)[lVar29] == '\x03') {
              sVar1 = *(short *)((long)&local_38[-1].x + lVar29);
              uVar14 = (uint)sVar1;
              sVar2 = *(short *)((long)&local_38->cx + lVar29);
              uVar3 = *(ushort *)((long)&local_38->cy + lVar29);
              sVar4 = *(short *)((long)&local_38->x + lVar29);
              uVar19 = (uint)sVar4;
              sVar26 = sVar2;
              if (sVar4 <= sVar2) {
                sVar26 = sVar4;
              }
              uVar5 = *(ushort *)((long)&local_38->y + lVar29);
              iVar21 = (int)(short)uVar5;
              if (sVar1 <= sVar26) {
                sVar26 = sVar1;
              }
              uVar28 = uVar5;
              if ((short)uVar3 < (short)uVar5) {
                uVar28 = uVar3;
              }
              uVar6 = *(ushort *)((long)local_38 + lVar29 + -0xc);
              iVar15 = (int)(short)uVar6;
              uVar27 = uVar3;
              if ((short)uVar3 <= (short)uVar5) {
                uVar27 = uVar5;
              }
              if ((short)uVar6 < (short)uVar28) {
                uVar28 = uVar6;
              }
              if ((short)uVar27 < (short)uVar6) {
                uVar27 = uVar6;
              }
              if (((fVar45 <= (float)(int)(short)uVar28) || ((float)(int)(short)uVar27 <= fVar45))
                 || (fVar50 <= (float)(int)sVar26)) goto LAB_00111a99;
              fVar36 = (float)(int)sVar4;
              fVar35 = (float)(int)((long)((ulong)uVar14 << 0x30) >> 0x30);
              local_198 = CONCAT44(fVar35,fVar36);
              uStack_190 = 0;
              fVar47 = (float)(int)(short)uVar5;
              fVar48 = (float)(int)((long)((ulong)uVar6 << 0x30) >> 0x30);
              fVar51 = (float)(int)sVar2;
              fVar41 = (float)(int)(short)uVar3;
              if ((fVar35 != fVar51) || (NAN(fVar35) || NAN(fVar51))) {
LAB_001116d6:
                local_178 = fVar51;
                fStack_174 = fVar52;
                fStack_170 = fVar53;
                fStack_16c = fVar54;
                if ((((fVar36 != fVar51) || (NAN(fVar36) || NAN(fVar51))) || (fVar47 != fVar41)) ||
                   (NAN(fVar47) || NAN(fVar41))) {
                  fVar38 = (float)((uint)-fVar35 & 0x80000000);
                  fVar39 = (float)((uint)-fVar35 & 0x80000000);
                  fVar40 = (float)((uint)-fVar35 & 0x80000000);
                  fVar37 = (float)((uint)-fVar35 & 0x80000000) + fVar48;
                  fVar59 = (float)((uint)-fVar52 & 0x80000000);
                  fVar60 = (float)((uint)-fVar53 & 0x80000000);
                  fVar61 = (float)((uint)-fVar54 & 0x80000000);
                  fVar35 = (float)((uint)-fVar51 & 0x80000000) + fVar41;
                  fVar36 = (fVar37 - (fVar35 + fVar35)) +
                           (float)((uint)-fVar36 & 0x80000000) + fVar47;
                  fVar35 = fVar35 - fVar37;
                  local_108 = fVar41;
                  fStack_104 = fVar42;
                  fStack_100 = fVar43;
                  fStack_fc = fVar44;
                  if ((fVar36 != 0.0) || (NAN(fVar36))) {
                    fVar42 = fVar35 * fVar35 - (fVar37 + fVar49) * fVar36;
                    if (0.0 < fVar42) {
                      local_68 = CONCAT44(fVar48,fVar47);
                      uStack_60 = 0;
                      if (fVar42 < 0.0) {
                        local_12c = fVar45;
                        local_58 = fVar36;
                        fStack_54 = fVar38;
                        fStack_50 = fVar39;
                        fStack_4c = fVar40;
                        local_48 = fVar35;
                        fStack_44 = fVar59;
                        fStack_40 = fVar60;
                        fStack_3c = fVar61;
                        fVar42 = sqrtf(fVar42);
                        fVar35 = local_48;
                        fVar59 = fStack_44;
                        fVar60 = fStack_40;
                        fVar61 = fStack_3c;
                        fVar45 = local_12c;
                        fVar55 = local_d8;
                        fVar56 = fStack_d4;
                        fVar57 = fStack_d0;
                        fVar58 = fStack_cc;
                        fVar36 = local_58;
                        fVar38 = fStack_54;
                        fVar39 = fStack_50;
                        fVar40 = fStack_4c;
                      }
                      else {
                        fVar42 = SQRT(fVar42);
                      }
                      fVar43 = (fVar35 + fVar42) * (-1.0 / fVar36);
                      fVar44 = (fVar35 - fVar42) * (-1.0 / fVar36);
                      bVar8 = fVar43 <= 1.0;
                      bVar9 = 0.0 <= fVar43;
                      bVar10 = bVar9 && bVar8;
                      fVar47 = (float)local_68;
                      fVar48 = local_68._4_4_;
                      uVar14 = (uint)uStack_60;
                      uVar19 = uStack_60._4_4_;
                      if (((fVar42 <= 0.0) || (fVar44 < 0.0)) || (1.0 < fVar44)) {
                        bVar10 = false;
                        fVar49 = local_158;
                        if (!bVar9 || !bVar8) goto LAB_00111a23;
                      }
                      else if (!bVar9 || !bVar8) {
                        fVar43 = fVar44;
                      }
                      goto LAB_00111948;
                    }
                    bVar8 = false;
                    bVar10 = false;
                  }
                  else {
                    fVar43 = (fVar37 + fVar49) / (fVar35 * -2.0);
                    bVar10 = false;
                    fVar44 = 0.0;
                    fVar59 = 0.0;
                    fVar60 = 0.0;
                    fVar61 = 0.0;
                    if ((fVar43 < 0.0) || (uVar14 = 0, uVar19 = 0, 1.0 < fVar43)) {
LAB_00111a23:
                      bVar8 = false;
                      bVar10 = false;
                      fVar52 = fStack_174;
                      fVar53 = fStack_170;
                      fVar54 = fStack_16c;
                    }
                    else {
LAB_00111948:
                      fVar52 = (float)((uint)fVar48 & 0x80000000) + local_198._4_4_;
                      fVar53 = ((float)((uint)local_108 & 0x80000000) + local_178) - fVar52;
                      fVar42 = ((float)((uint)fVar47 & 0x80000000) + (float)local_198) - fVar52;
                      local_f8 = fVar43 * fVar43 * fVar42 +
                                 (2.0 - (fVar43 + fVar43)) * fVar43 * fVar53 + (fVar52 - local_1b4);
                      local_e8 = fVar36 * fVar43 + fVar35;
                      if (bVar10) {
                        local_1a8 = fVar44 * fVar44 * fVar42 +
                                    (2.0 - (fVar44 + fVar44)) * fVar44 * fVar53 +
                                    (fVar52 - local_1b4);
                        local_b8 = fVar36 * fVar44 + fVar35;
                      }
                      bVar8 = true;
                      fVar49 = local_158;
                      fVar53 = (float)(uVar14 & 0x80000000) + (float)uStack_190;
                      fVar54 = (float)(uVar19 & 0x80000000) + uStack_190._4_4_;
                      fStack_e4 = fVar38;
                      fStack_e0 = fVar39;
                      fStack_dc = fVar40;
                    }
                  }
                  iVar21 = ((0.0 <= local_e8) - 1) + (uint)(0.0 <= local_e8);
                  if (0.0 <= local_f8) {
                    iVar21 = 0;
                  }
                  if (!bVar8) {
                    iVar21 = 0;
                  }
                  iVar15 = ((0.0 <= local_b8) - 1) + (uint)(0.0 <= local_b8);
                  if (0.0 <= local_1a8) {
                    iVar15 = 0;
                  }
                  if (!bVar10) {
                    iVar15 = 0;
                  }
                  iVar23 = iVar15 + iVar21 + iVar23;
                  goto LAB_00111a99;
                }
              }
              else if ((fVar48 != fVar41) || (NAN(fVar48) || NAN(fVar41))) goto LAB_001116d6;
              iVar18 = iVar21;
              if ((short)uVar6 < (short)uVar5) {
                iVar18 = iVar15;
              }
              if ((float)iVar18 < fVar45) {
                iVar18 = iVar21;
                if ((short)uVar5 < (short)uVar6) {
                  iVar18 = iVar15;
                }
                if (fVar45 < (float)iVar18) {
                  uVar25 = uVar19;
                  if ((int)uVar14 < (int)uVar19) {
                    uVar25 = uVar14;
                  }
                  if ((float)(int)uVar25 < fVar50) {
                    bVar8 = (short)uVar6 < (short)uVar5;
                    fVar35 = (float)(int)(uVar19 - uVar14) *
                             ((fVar45 - fVar48) / (float)(iVar21 - iVar15)) + fVar35;
                    goto LAB_00111775;
                  }
                }
              }
            }
            else if ((&local_38->type)[lVar29] == '\x02') {
              sVar1 = *(short *)((long)local_38 + lVar29 + -0xc);
              iVar15 = (int)sVar1;
              sVar2 = *(short *)((long)&local_38->y + lVar29);
              iVar18 = (int)sVar2;
              iVar21 = iVar18;
              if (sVar1 < sVar2) {
                iVar21 = iVar15;
              }
              if ((float)iVar21 < fVar45) {
                iVar21 = iVar18;
                if (sVar2 < sVar1) {
                  iVar21 = iVar15;
                }
                if (fVar45 < (float)iVar21) {
                  iVar20 = (int)*(short *)((long)&local_38[-1].x + lVar29);
                  iVar24 = (int)*(short *)((long)&local_38->x + lVar29);
                  iVar21 = iVar24;
                  if (iVar20 < iVar24) {
                    iVar21 = iVar20;
                  }
                  if (fVar50 <= (float)iVar21) goto LAB_00111a99;
                  bVar8 = sVar1 < sVar2;
                  fVar35 = (float)iVar20 +
                           (float)(iVar24 - iVar20) *
                           ((fVar45 - (float)iVar15) / (float)(iVar18 - iVar15));
LAB_00111775:
                  iVar21 = (uint)bVar8 * 2 + -1;
                  if (fVar50 <= fVar35) {
                    iVar21 = 0;
                  }
                  iVar23 = iVar23 + iVar21;
                }
              }
            }
LAB_00111a99:
            lVar29 = lVar29 + 0xe;
            fVar42 = fVar59;
            fVar43 = fVar60;
            fVar44 = fVar61;
          }
          fVar35 = 999999.0;
          fVar45 = 0.0;
          fVar49 = 0.0;
          fVar50 = 0.0;
          psVar17 = local_78;
          for (uVar30 = 0; uVar22 != uVar30; uVar30 = uVar30 + 1) {
            uVar14._0_2_ = psVar17[1].x;
            uVar14._2_2_ = psVar17[1].y;
            auVar34 = pshuflw(ZEXT416(uVar14),ZEXT416(uVar14),0x60);
            fVar47 = (float)(auVar34._0_4_ >> 0x10) * fVar55;
            fVar42 = (float)(auVar34._4_4_ >> 0x10) * fVar56;
            fVar36 = (float)(auVar34._8_4_ >> 0x10) * fVar57;
            fVar41 = (float)(auVar34._12_4_ >> 0x10) * fVar58;
            local_198 = CONCAT44(fVar42,fVar47);
            uStack_190 = CONCAT44(fVar41,fVar36);
            fVar48 = fVar47 - fVar32;
            fVar51 = fVar42 - fVar46;
            fVar43 = fVar48 * fVar48 + fVar51 * fVar51;
            uVar14 = -(uint)(fVar43 < fVar35 * fVar35);
            fVar59 = (float)((uint)fVar59 & (uint)fVar42);
            fVar60 = (float)((uint)fVar60 & (uint)fVar36);
            fVar61 = (float)((uint)fVar61 & (uint)fVar41);
            fVar35 = (float)(~uVar14 & (uint)fVar35 | (uint)SQRT(fVar43) & uVar14);
            fVar45 = (float)(~(uint)fVar42 & (uint)fVar45 | (uint)fVar59);
            fVar49 = (float)(~(uint)fVar36 & (uint)fVar49 | (uint)fVar60);
            fVar50 = (float)(~(uint)fVar41 & (uint)fVar50 | (uint)fVar61);
            fVar43 = fVar42;
            fVar44 = fVar42;
            if (psVar17[1].type == '\x03') {
              uVar19._0_2_ = psVar17->x;
              uVar19._2_2_ = psVar17->y;
              auVar34 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0x60);
              local_e8 = (float)(auVar34._0_4_ >> 0x10) * fVar55;
              local_108 = (float)(auVar34._4_4_ >> 0x10) * fVar56;
              fStack_e0 = (float)(auVar34._8_4_ >> 0x10) * fVar57;
              fStack_dc = (float)(auVar34._12_4_ >> 0x10) * fVar58;
              uVar25._0_2_ = psVar17[1].cx;
              uVar25._2_2_ = psVar17[1].cy;
              auVar34 = pshuflw(ZEXT416(uVar25),ZEXT416(uVar25),0x60);
              local_f8 = (float)(auVar34._0_4_ >> 0x10) * fVar55;
              fStack_f4 = (float)(auVar34._4_4_ >> 0x10) * fVar56;
              fStack_f0 = (float)(auVar34._8_4_ >> 0x10) * fVar57;
              fStack_ec = (float)(auVar34._12_4_ >> 0x10) * fVar58;
              uVar14 = -(uint)(fVar47 < local_f8);
              uVar19 = -(uint)(fVar42 < fStack_f4);
              fVar61 = (float)(~uVar19 & (uint)fVar42 | (uint)fStack_f4 & uVar19);
              fVar39 = (float)(~uVar14 & (uint)fVar47 | (uint)local_f8 & uVar14);
              fVar60 = (float)(~uVar19 & (uint)fStack_f4 | (uint)fVar42 & uVar19);
              fVar59 = (float)(~uVar14 & (uint)local_f8 | (uint)fVar47 & uVar14);
              auVar34._4_4_ = -(uint)(fVar39 < local_e8);
              auVar34._0_4_ = -(uint)(fVar61 < local_108);
              auVar34._8_4_ = -(uint)(fVar60 < local_108);
              auVar34._12_4_ = -(uint)(fVar59 < local_e8);
              uVar14 = movmskps(3,auVar34);
              fVar38 = fVar59;
              if ((uVar14 & 8) == 0) {
                fVar38 = local_e8;
              }
              if ((uVar14 & 4) == 0) {
                fVar60 = local_108;
                fVar59 = local_108;
              }
              fVar40 = local_e8;
              if ((uVar14 & 2) == 0) {
                fVar40 = fVar39;
              }
              fVar39 = local_108;
              if ((uVar14 & 1) == 0) {
                fVar39 = fVar61;
              }
              fVar61 = fVar59;
              local_178 = fVar35;
              fStack_174 = fVar45;
              fStack_170 = fVar49;
              fStack_16c = fVar50;
              local_158 = fVar42;
              fStack_154 = fVar42;
              fStack_150 = fVar42;
              fStack_14c = fVar42;
              fStack_104 = local_108;
              fStack_100 = local_108;
              fStack_fc = local_108;
              fStack_e4 = local_108;
              if ((((fVar38 - fVar35 < fVar32) && (fVar32 < fVar40 + fVar35)) &&
                  (fVar60 - fVar35 < fVar46)) && (fVar46 < fVar39 + fVar35)) {
                fVar61 = local_f8 - fVar47;
                fVar52 = fStack_f4 - fVar42;
                fVar53 = fStack_f0 - fVar36;
                fVar54 = fStack_ec - fVar41;
                fVar50 = fStack_f4 - fVar42;
                fVar49 = (fVar47 - (local_f8 + local_f8)) + local_e8;
                fVar59 = (fVar42 - (fStack_f4 + fStack_f4)) + local_108;
                fVar45 = *(float *)(local_160 + uVar30 * 4);
                fVar60 = (fVar61 * fVar49 + fVar50 * fVar59) * 3.0;
                local_b8 = fStack_f4;
                fStack_b4 = fStack_f4;
                fStack_b0 = fStack_f4;
                fStack_ac = fStack_f4;
                if ((fVar45 != 0.0) || (NAN(fVar45))) {
                  fVar60 = fVar60 * fVar45;
                  fVar43 = fVar61 * fVar61 + fVar50 * fVar50;
                  fVar43 = (fVar43 + fVar43 + fVar49 * fVar48 + fVar59 * fVar51) * fVar45;
                  local_148 = fVar60 / -3.0;
                  fVar49 = (fVar60 * fVar60) / -3.0 + fVar43;
                  fStack_1a4 = fVar60 * ((fVar60 + fVar60) * fVar60 + fVar43 * -9.0);
                  fVar43 = fVar53 * (fVar42 * fVar53 + fVar42 * 0.0);
                  fVar44 = fVar54 * (fVar52 * fVar54 + fVar52 * 0.0);
                  local_1a8 = fStack_1a4 / 27.0 + fVar45 * (fVar48 * fVar61 + fVar50 * fVar51);
                  fVar42 = fVar49 * fVar49 * fVar49;
                  fVar45 = local_1a8 * local_1a8 + (fVar42 * 4.0) / 27.0;
                  fStack_1a0 = fStack_1a4;
                  fStack_19c = fStack_1a4;
                  if (fVar45 < 0.0) {
                    fVar49 = fVar49 / -3.0;
                    fVar45 = fStack_1a4;
                    if (fVar49 < 0.0) {
                      local_118 = (double)CONCAT44(fVar52,fVar42);
                      fStack_144 = fVar52;
                      fStack_140 = fVar53;
                      fStack_13c = fVar54;
                      fStack_110 = fVar53;
                      fStack_10c = fVar54;
                      local_c8 = sqrtf(fVar49);
                      fVar42 = (float)local_118;
                    }
                    else {
                      local_c8 = SQRT(fVar49);
                      fStack_144 = fVar52;
                      fStack_140 = fVar53;
                      fStack_13c = fVar54;
                    }
                    fVar54 = fVar44;
                    fVar53 = fVar43;
                    fVar52 = fVar45;
                    dVar33 = (double)(-27.0 / fVar42);
                    if (dVar33 < 0.0) {
                      dVar33 = sqrt(dVar33);
                    }
                    else {
                      dVar33 = SQRT(dVar33);
                    }
                    dVar33 = acos((double)local_1a8 * dVar33 * -0.5);
                    local_118 = (double)((float)dVar33 / 3.0);
                    dVar33 = cos(local_118);
                    local_1a8 = (float)dVar33;
                    dVar33 = cos(local_118 + -1.570796);
                    fVar45 = local_c8 + local_c8;
                    fVar42 = (float)((ulong)dVar33 >> 0x20);
                    fVar43 = (float)extraout_XMM0_Qb;
                    fVar44 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
                    local_118 = (double)CONCAT44(fStack_144,
                                                 local_148 -
                                                 ((float)dVar33 * 1.7320508 + local_1a8) * local_c8)
                    ;
                    fStack_110 = fStack_140;
                    fStack_10c = fStack_13c;
                    local_c8 = local_148 - (local_1a8 - (float)dVar33 * 1.7320508) * local_c8;
                    fStack_c4 = fStack_144;
                    fStack_c0 = fStack_140;
                    fStack_bc = fStack_13c;
                    fStack_144 = 0.0;
                    fStack_140 = 0.0;
                    fStack_13c = 0.0;
                    bVar11 = 1;
                    bVar12 = 1;
                    local_148 = fVar45 * local_1a8 + local_148;
                  }
                  else {
                    fVar42 = fStack_1a4;
                    if (fVar45 < 0.0) {
                      fStack_144 = fVar52;
                      fStack_140 = fVar53;
                      fStack_13c = fVar54;
                      fVar45 = sqrtf(fVar45);
                    }
                    else {
                      fVar45 = SQRT(fVar45);
                      fStack_144 = fVar52;
                      fStack_140 = fVar53;
                      fStack_13c = fVar54;
                    }
                    fVar54 = fVar44;
                    fVar53 = fVar43;
                    fVar52 = fVar42;
                    fVar49 = fVar45 - local_1a8;
                    fStack_1a4 = -fStack_1a4;
                    fStack_1a0 = -fStack_1a0;
                    fStack_19c = -fStack_19c;
                    fVar42 = 0.0;
                    fVar43 = 0.0;
                    fVar44 = 0.0;
                    local_1a8 = (-local_1a8 - fVar45) * 0.5;
                    local_1b4 = stbtt__cuberoot(fVar49 * 0.5);
                    fVar45 = stbtt__cuberoot(local_1a8);
                    local_148 = local_148 + local_1b4 + fVar45;
                    bVar11 = 0;
                    bVar12 = 0;
                  }
                  bVar8 = true;
                  fVar55 = local_d8;
                  fVar56 = fStack_d4;
                  fVar57 = fStack_d0;
                  fVar58 = fStack_cc;
                }
                else {
                  fVar45 = fVar61 * fVar61 + fVar50 * fVar50;
                  fVar45 = fVar45 + fVar45 + fVar49 * fVar48 + fVar59 * fVar51;
                  fVar49 = fVar61 * fVar48 + fVar50 * fVar51;
                  if ((fVar60 != 0.0) || (NAN(fVar60))) {
                    fVar49 = fVar45 * fVar45 + fVar49 * fVar60 * -4.0;
                    local_1a8 = fVar45;
                    fStack_1a4 = fVar52;
                    fStack_1a0 = fVar53;
                    fStack_19c = fVar54;
                    if (fVar49 < 0.0) goto LAB_00111f1a;
                    if (fVar49 < 0.0) {
                      local_148 = fVar60;
                      fStack_144 = fVar52;
                      fStack_140 = fVar53;
                      fStack_13c = fVar54;
                      fVar49 = sqrtf(fVar49);
                      fVar52 = fStack_144;
                      fVar53 = fStack_140;
                      fVar54 = fStack_13c;
                      fVar55 = local_d8;
                      fVar56 = fStack_d4;
                      fVar57 = fStack_d0;
                      fVar58 = fStack_cc;
                      fVar45 = extraout_XMM0_Db;
                      fStack_10c = extraout_XMM0_Dd;
                    }
                    else {
                      fVar49 = SQRT(fVar49);
                      local_148 = fVar60;
                      fVar45 = fVar52;
                      fStack_10c = fVar54;
                    }
                    fStack_144 = -fStack_1a4;
                    fStack_140 = -fStack_1a0;
                    fStack_13c = -fStack_19c;
                    fVar50 = local_148 + local_148;
                    local_148 = (-local_1a8 - fVar49) / fVar50;
                    local_118 = (double)CONCAT44(fVar45,(fVar49 - local_1a8) / fVar50);
                    fStack_110 = 0.0;
                    bVar8 = true;
                    bVar12 = 0;
                    bVar11 = 1;
                  }
                  else {
                    if ((fVar45 != 0.0) || (NAN(fVar45))) {
                      fStack_144 = -fVar52;
                      fStack_140 = -fVar53;
                      fStack_13c = -fVar54;
                      local_148 = -fVar49 / fVar45;
                      bVar8 = true;
                    }
                    else {
LAB_00111f1a:
                      bVar8 = false;
                    }
                    bVar11 = 0;
                    bVar12 = 0;
                  }
                }
                fVar35 = local_178;
                if (((bVar8) && (0.0 <= local_148)) && (local_148 <= 1.0)) {
                  fVar43 = 1.0 - local_148;
                  fVar44 = (local_148 + local_148) * fVar43;
                  fVar42 = (local_148 * local_148 * local_e8 +
                           fVar43 * fVar43 * (float)local_198 + local_f8 * fVar44) - fVar32;
                  fVar43 = (local_148 * local_148 * local_108 +
                           fVar43 * fVar43 * local_158 + fVar44 * local_b8) - fVar46;
                  fVar45 = fVar42 * fVar42 + fVar43 * fVar43;
                  fVar42 = fStack_144;
                  fVar43 = fStack_140;
                  fVar44 = fStack_13c;
                  if (fVar45 < local_178 * local_178) {
                    fVar35 = SQRT(fVar45);
                  }
                }
                if ((bool)(bVar11 & ((float)local_118 <= 1.0 && 0.0 <= (float)local_118))) {
                  fVar43 = 1.0 - (float)local_118;
                  fVar44 = ((float)local_118 + (float)local_118) * fVar43;
                  fVar42 = ((float)local_118 * (float)local_118 * local_e8 +
                           fVar43 * fVar43 * (float)local_198 + local_f8 * fVar44) - fVar32;
                  fVar43 = ((float)local_118 * (float)local_118 * local_108 +
                           fVar43 * fVar43 * local_158 + fVar44 * local_b8) - fVar46;
                  fVar45 = fVar42 * fVar42 + fVar43 * fVar43;
                  fVar42 = local_118._4_4_;
                  fVar43 = fStack_110;
                  fVar44 = fStack_10c;
                  if (fVar45 < fVar35 * fVar35) {
                    fVar35 = SQRT(fVar45);
                  }
                }
                fVar59 = fStack_c4;
                fVar60 = fStack_c0;
                fVar61 = fStack_bc;
                fVar45 = fStack_174;
                fVar49 = fStack_170;
                fVar50 = fStack_16c;
                if ((bool)(bVar12 & (0.0 <= local_c8 && local_c8 <= 1.0))) {
                  fVar43 = 1.0 - local_c8;
                  fVar44 = (local_c8 + local_c8) * fVar43;
                  fVar42 = (local_c8 * local_c8 * local_e8 +
                           fVar43 * fVar43 * (float)local_198 + local_f8 * fVar44) - fVar32;
                  fVar43 = (local_c8 * local_c8 * local_108 +
                           fVar43 * fVar43 * local_158 + local_b8 * fVar44) - fVar46;
                  fVar47 = fVar42 * fVar42 + fVar43 * fVar43;
                  fVar42 = fStack_c4;
                  fVar43 = fStack_c0;
                  fVar44 = fStack_bc;
                  if (fVar47 < fVar35 * fVar35) {
                    fVar35 = SQRT(fVar47);
                  }
                }
              }
            }
            else if (psVar17[1].type == '\x02') {
              fVar47 = (float)(int)psVar17->x * local_88 - fVar47;
              fVar41 = (float)(int)psVar17->y * local_98 - fVar42;
              fVar36 = ABS(fVar47 * fVar51 - fVar48 * fVar41) * *(float *)(local_160 + uVar30 * 4);
              if (fVar36 < fVar35) {
                fVar47 = -(fVar48 * fVar47 + fVar51 * fVar41) / (fVar47 * fVar47 + fVar41 * fVar41);
                uVar14 = -(uint)(0.0 <= fVar47);
                uVar19 = -(uint)(fVar47 <= 1.0);
                fVar35 = (float)(~uVar14 & (uint)fVar35 |
                                (~uVar19 & (uint)fVar35 | (uint)fVar36 & uVar19) & uVar14);
              }
            }
            psVar17 = psVar17 + 1;
          }
          if (iVar23 == 0) {
            fVar35 = -fVar35;
          }
          fVar32 = fVar35 * local_120 + local_124;
          fVar45 = 0.0;
          if ((0.0 <= fVar32) && (fVar45 = fVar32, 255.0 < fVar32)) {
            fVar45 = 255.0;
          }
          local_a0[(local_180 - local_1ac) + (local_184 - local_1b8) * local_188] =
               (uchar)(int)fVar45;
          puVar16 = local_a0;
          iVar21 = local_180 + 1;
        }
        iVar23 = local_184 + 1;
      } while( true );
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBTT_DEF unsigned char * stbtt_GetGlyphSDF(const stbtt_fontinfo *info, float scale, int glyph, int padding, unsigned char onedge_value, float pixel_dist_scale, int *width, int *height, int *xoff, int *yoff)
{
float scale_x = scale, scale_y = scale;
int ix0,iy0,ix1,iy1;
int w,h;
unsigned char *data;

if (scale == 0) return NULL;

stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale, scale, 0.0f,0.0f, &ix0,&iy0,&ix1,&iy1);

/*  if empty, return NULL */
if (ix0 == ix1 || iy0 == iy1)
return NULL;

ix0 -= padding;
iy0 -= padding;
ix1 += padding;
iy1 += padding;

w = (ix1 - ix0);
h = (iy1 - iy0);

if (width ) *width  = w;
if (height) *height = h;
if (xoff  ) *xoff   = ix0;
if (yoff  ) *yoff   = iy0;

/*  invert for y-downwards bitmaps */
scale_y = -scale_y;

{
int x,y,i,j;
float *precompute;
stbtt_vertex *verts;
int num_verts = stbtt_GetGlyphShape(info, glyph, &verts);
data = (unsigned char *) STBTT_malloc(w * h, info->userdata);
precompute = (float *) STBTT_malloc(num_verts * sizeof(float), info->userdata);

for (i=0,j=num_verts-1; i < num_verts; j=i++) {
if (verts[i].type == STBTT_vline) {
float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;
float x1 = verts[j].x*scale_x, y1 = verts[j].y*scale_y;
float dist = (float) STBTT_sqrt((x1-x0)*(x1-x0) + (y1-y0)*(y1-y0));
precompute[i] = (dist == 0) ? 0.0f : 1.0f / dist;
} else if (verts[i].type == STBTT_vcurve) {
float x2 = verts[j].x *scale_x, y2 = verts[j].y *scale_y;
float x1 = verts[i].cx*scale_x, y1 = verts[i].cy*scale_y;
float x0 = verts[i].x *scale_x, y0 = verts[i].y *scale_y;
float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
float len2 = bx*bx + by*by;
if (len2 != 0.0f)
precompute[i] = 1.0f / (bx*bx + by*by);
else
precompute[i] = 0.0f;
} else
precompute[i] = 0.0f;
}

for (y=iy0; y < iy1; ++y) {
for (x=ix0; x < ix1; ++x) {
float val;
float min_dist = 999999.0f;
float sx = (float) x + 0.5f;
float sy = (float) y + 0.5f;
float x_gspace = (sx / scale_x);
float y_gspace = (sy / scale_y);

int winding = stbtt__compute_crossings_x(x_gspace, y_gspace, num_verts, verts); /*  @OPTIMIZE: this could just be a rasterization, but needs to be line vs. non-tesselated curves so a new path */

for (i=0; i < num_verts; ++i) {
float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;

/*  check against every point here rather than inside line/curve primitives -- @TODO: wrong if multiple 'moves' in a row produce a garbage point, and given culling, probably more efficient to do within line/curve */
float dist2 = (x0-sx)*(x0-sx) + (y0-sy)*(y0-sy);
if (dist2 < min_dist*min_dist)
min_dist = (float) STBTT_sqrt(dist2);

if (verts[i].type == STBTT_vline) {
float x1 = verts[i-1].x*scale_x, y1 = verts[i-1].y*scale_y;

/*  coarse culling against bbox */
/* if (sx > STBTT_min(x0,x1)-min_dist && sx < STBTT_max(x0,x1)+min_dist && */
/*     sy > STBTT_min(y0,y1)-min_dist && sy < STBTT_max(y0,y1)+min_dist) */
float dist = (float) STBTT_fabs((x1-x0)*(y0-sy) - (y1-y0)*(x0-sx)) * precompute[i];
STBTT_assert(i != 0);
if (dist < min_dist) {
/*  check position along line */
/*  x' = x0 + t*(x1-x0), y' = y0 + t*(y1-y0) */
/*  minimize (x'-sx)*(x'-sx)+(y'-sy)*(y'-sy) */
float dx = x1-x0, dy = y1-y0;
float px = x0-sx, py = y0-sy;
/*  minimize (px+t*dx)^2 + (py+t*dy)^2 = px*px + 2*px*dx*t + t^2*dx*dx + py*py + 2*py*dy*t + t^2*dy*dy */
/*  derivative: 2*px*dx + 2*py*dy + (2*dx*dx+2*dy*dy)*t, set to 0 and solve */
float t = -(px*dx + py*dy) / (dx*dx + dy*dy);
if (t >= 0.0f && t <= 1.0f)
min_dist = dist;
}
} else if (verts[i].type == STBTT_vcurve) {
float x2 = verts[i-1].x *scale_x, y2 = verts[i-1].y *scale_y;
float x1 = verts[i  ].cx*scale_x, y1 = verts[i  ].cy*scale_y;
float box_x0 = STBTT_min(STBTT_min(x0,x1),x2);
float box_y0 = STBTT_min(STBTT_min(y0,y1),y2);
float box_x1 = STBTT_max(STBTT_max(x0,x1),x2);
float box_y1 = STBTT_max(STBTT_max(y0,y1),y2);
/*  coarse culling against bbox to avoid computing cubic unnecessarily */
if (sx > box_x0-min_dist && sx < box_x1+min_dist && sy > box_y0-min_dist && sy < box_y1+min_dist) {
int num=0;
float ax = x1-x0, ay = y1-y0;
float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
float mx = x0 - sx, my = y0 - sy;
float res[3],px,py,t,it;
float a_inv = precompute[i];
if (a_inv == 0.0) { /*  if a_inv is 0, it's 2nd degree so use quadratic formula */
float a = 3*(ax*bx + ay*by);
float b = 2*(ax*ax + ay*ay) + (mx*bx+my*by);
float c = mx*ax+my*ay;
if (a == 0.0) { /*  if a is 0, it's linear */
if (b != 0.0) {
res[num++] = -c/b;
}
} else {
float discriminant = b*b - 4*a*c;
if (discriminant < 0)
num = 0;
else {
float root = (float) STBTT_sqrt(discriminant);
res[0] = (-b - root)/(2*a);
res[1] = (-b + root)/(2*a);
num = 2; /*  don't bother distinguishing 1-solution case, as code below will still work */
}
}
} else {
float b = 3*(ax*bx + ay*by) * a_inv; /*  could precompute this as it doesn't depend on sample point */
float c = (2*(ax*ax + ay*ay) + (mx*bx+my*by)) * a_inv;
float d = (mx*ax+my*ay) * a_inv;
num = stbtt__solve_cubic(b, c, d, res);
}
if (num >= 1 && res[0] >= 0.0f && res[0] <= 1.0f) {
t = res[0], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
if (num >= 2 && res[1] >= 0.0f && res[1] <= 1.0f) {
t = res[1], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
if (num >= 3 && res[2] >= 0.0f && res[2] <= 1.0f) {
t = res[2], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
}
}
}
if (winding == 0)
min_dist = -min_dist;  /*  if outside the shape, value is negative */
val = onedge_value + pixel_dist_scale * min_dist;
if (val < 0)
val = 0;
else if (val > 255)
val = 255;
data[(y-iy0)*w+(x-ix0)] = (unsigned char) val;
}
}
STBTT_free(precompute, info->userdata);
STBTT_free(verts, info->userdata);
}
return data;
}